

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binarymodelserialiser.cpp
# Opt level: O1

bool __thiscall
BinaryModelSerialiserPrivate::writeBinary(BinaryModelSerialiserPrivate *this,QDataStream *writer)

{
  QAbstractItemModel *pQVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  QDataStream *pQVar5;
  int *piVar6;
  bool bVar7;
  QVariant roleData;
  undefined1 local_50 [32];
  
  if ((this->super_AbstractModelSerialiserPrivate).m_constModel == (QAbstractItemModel *)0x0) {
    bVar7 = false;
  }
  else {
    iVar3 = *(int *)(writer + 0x18);
    *(undefined4 *)(writer + 0x18) = 0xd;
    QDataStream::operator<<(writer,iVar3);
    *(int *)(writer + 0x18) = iVar3;
    local_50._0_8_ = (QArrayData *)0x0;
    local_50._8_8_ = L"808FC674-78A0-4682-9C17-E05B18A0CDD3";
    local_50._16_8_ = (QAbstractItemModel *)0x24;
    ::operator<<(writer,(QString *)local_50);
    if ((QArrayData *)local_50._0_8_ != (QArrayData *)0x0) {
      LOCK();
      *(int *)local_50._0_8_ = *(int *)local_50._0_8_ + -1;
      UNLOCK();
      if (*(int *)local_50._0_8_ == 0) {
        QArrayData::deallocate((QArrayData *)local_50._0_8_,2,8);
      }
    }
    local_50._0_8_ = (Data *)0xffffffffffffffff;
    local_50._8_8_ = (char16_t *)0x0;
    local_50._16_8_ = (QAbstractItemModel *)0x0;
    writeBinaryElement(this,writer,(QModelIndex *)local_50);
    pQVar1 = (this->super_AbstractModelSerialiserPrivate).m_constModel;
    local_50._0_8_ = (Data *)0xffffffffffffffff;
    local_50._8_8_ = (char16_t *)0x0;
    local_50._16_8_ = (QAbstractItemModel *)0x0;
    iVar3 = (**(code **)(*(long *)pQVar1 + 0x80))(pQVar1,local_50);
    if (0 < iVar3) {
      iVar3 = 0;
      do {
        if ((this->super_AbstractModelSerialiserPrivate).m_rolesToSave.d.size != 0) {
          piVar6 = (this->super_AbstractModelSerialiserPrivate).m_rolesToSave.d.ptr;
          do {
            pQVar1 = (this->super_AbstractModelSerialiserPrivate).m_constModel;
            (**(code **)(*(long *)pQVar1 + 0xa0))((QVariant *)local_50,pQVar1,iVar3,1,*piVar6);
            cVar2 = ::QVariant::isNull();
            if (cVar2 == '\0') {
              pQVar5 = (QDataStream *)QDataStream::operator<<(writer,*piVar6);
              ::operator<<(pQVar5,(QVariant *)local_50);
            }
            ::QVariant::~QVariant((QVariant *)local_50);
            piVar6 = piVar6 + 1;
          } while (piVar6 != (this->super_AbstractModelSerialiserPrivate).m_rolesToSave.d.ptr +
                             (this->super_AbstractModelSerialiserPrivate).m_rolesToSave.d.size);
        }
        QDataStream::operator<<(writer,-1);
        iVar3 = iVar3 + 1;
        pQVar1 = (this->super_AbstractModelSerialiserPrivate).m_constModel;
        local_50._0_8_ = (PrivateShared *)0xffffffffffffffff;
        local_50._8_8_ = (char16_t *)0x0;
        local_50._16_8_ = (QAbstractItemModel *)0x0;
        iVar4 = (**(code **)(*(long *)pQVar1 + 0x80))(pQVar1,(QVariant *)local_50);
      } while (iVar3 < iVar4);
    }
    local_50._0_8_ = (Data *)0xffffffffffffffff;
    local_50._8_8_ = (char16_t *)0x0;
    local_50._16_8_ = (QAbstractItemModel *)0x0;
    iVar3 = (**(code **)(*(long *)(this->super_AbstractModelSerialiserPrivate).m_constModel + 0x78))
                      ();
    if (0 < iVar3) {
      iVar3 = 0;
      do {
        if ((this->super_AbstractModelSerialiserPrivate).m_rolesToSave.d.size != 0) {
          piVar6 = (this->super_AbstractModelSerialiserPrivate).m_rolesToSave.d.ptr;
          do {
            pQVar1 = (this->super_AbstractModelSerialiserPrivate).m_constModel;
            (**(code **)(*(long *)pQVar1 + 0xa0))((QVariant *)local_50,pQVar1,iVar3,2,*piVar6);
            cVar2 = ::QVariant::isNull();
            if (cVar2 == '\0') {
              pQVar5 = (QDataStream *)QDataStream::operator<<(writer,*piVar6);
              ::operator<<(pQVar5,(QVariant *)local_50);
            }
            ::QVariant::~QVariant((QVariant *)local_50);
            piVar6 = piVar6 + 1;
          } while (piVar6 != (this->super_AbstractModelSerialiserPrivate).m_rolesToSave.d.ptr +
                             (this->super_AbstractModelSerialiserPrivate).m_rolesToSave.d.size);
        }
        QDataStream::operator<<(writer,-1);
        iVar3 = iVar3 + 1;
        pQVar1 = (this->super_AbstractModelSerialiserPrivate).m_constModel;
        local_50._0_8_ = (PrivateShared *)0xffffffffffffffff;
        local_50._8_8_ = (char16_t *)0x0;
        local_50._16_8_ = (QAbstractItemModel *)0x0;
        iVar4 = (**(code **)(*(long *)pQVar1 + 0x78))(pQVar1,(QVariant *)local_50);
      } while (iVar3 < iVar4);
    }
    iVar3 = QDataStream::status();
    bVar7 = iVar3 == 0;
  }
  return bVar7;
}

Assistant:

bool BinaryModelSerialiserPrivate::writeBinary(QDataStream &writer) const
{
    if (!m_constModel)
        return false;
    const qint32 writerVersion = writer.version();
    writer.setVersion(QDataStream::Qt_5_0);
    writer << writerVersion;
    writer.setVersion(writerVersion);
    writer << Magic_Model_Header;
    writeBinaryElement(writer);
    for (int i = 0; i < m_constModel->columnCount(); ++i) {
        for (QList<int>::const_iterator singleRole = m_rolesToSave.constBegin(); singleRole != m_rolesToSave.constEnd(); ++singleRole) {
            const QVariant roleData = m_constModel->headerData(i, Qt::Horizontal, *singleRole);
            if (roleData.isNull())
                continue;
            writer << static_cast<qint32>(*singleRole) << roleData;
        }
        writer << static_cast<qint32>(-1);
    }
    for (int i = 0; i < m_constModel->rowCount(); ++i) {
        for (QList<int>::const_iterator singleRole = m_rolesToSave.constBegin(); singleRole != m_rolesToSave.constEnd(); ++singleRole) {
            const QVariant roleData = m_constModel->headerData(i, Qt::Vertical, *singleRole);
            if (roleData.isNull())
                continue;
            writer << static_cast<qint32>(*singleRole) << roleData;
        }
        writer << static_cast<qint32>(-1);
    }
    return writer.status() == QDataStream::Ok;
}